

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int64_t this;
  ostream *poVar1;
  long local_180;
  duration<long,_std::ratio<1L,_1000L>_> local_178;
  duration local_170;
  duration local_168;
  TimeValue local_160;
  long local_150;
  int64_t row;
  Metric *metric;
  Directory out_directory;
  undefined1 local_90 [8];
  json config;
  undefined1 local_78 [8];
  string metric_name;
  int64_t count;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string config_file;
  char **argv_local;
  int argc_local;
  
  config_file.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"config.json",&local_39);
  std::allocator<char>::~allocator(&local_39);
  metric_name.field_2._8_8_ = 600000000;
  if (1 < argc) {
    std::__cxx11::string::operator=((string *)local_38,*(char **)(config_file.field_2._8_8_ + 8));
  }
  if (2 < argc) {
    metric_name.field_2._8_8_ = atoll(*(char **)(config_file.field_2._8_8_ + 0x10));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"dummy",(allocator<char> *)((long)&config.m_value + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&config.m_value + 7));
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&out_directory.mutex_.mutex_.super__Optional_base<std::mutex,_false,_false>.
                      _M_payload.super__Optional_payload_base<std::mutex>._M_engaged,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             auto_format);
  read_json_from_file((path *)local_90);
  std::filesystem::__cxx11::path::~path
            ((path *)&out_directory.mutex_.mutex_.super__Optional_base<std::mutex,_false,_false>.
                      _M_payload.super__Optional_payload_base<std::mutex>._M_engaged);
  hta::Directory::Directory((Directory *)&metric,(json *)local_90,false);
  row = (int64_t)hta::Directory::operator[]((Directory *)&metric,(string *)local_78);
  for (local_150 = 0; local_150 < (long)metric_name.field_2._8_8_; local_150 = local_150 + 1) {
    if (local_150 % 1000000 == 0) {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,local_150);
      poVar1 = std::operator<<(poVar1," rows completed.");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    this = row;
    local_180 = local_150 * 0x32 + 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_178,&local_180);
    local_170.__r =
         (rep)hta::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        (&local_178);
    hta::Clock::time_point::time_point((time_point *)&local_168,&local_170);
    hta::TimeValue::TimeValue(&local_160,(TimePoint)local_168.__r,42.0);
    hta::Metric::insert((Metric *)this,local_160);
  }
  hta::Directory::~Directory((Directory *)&metric);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_90);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    std::string config_file = "config.json";
    std::int64_t count = 600000000;
    if (argc > 1)
    {
        config_file = argv[1];
    }
    if (argc > 2)
    {
        count = atoll(argv[2]);
    }
    std::string metric_name = "dummy";

    auto config = read_json_from_file(std::filesystem::path(config_file));
    hta::Directory out_directory(config);
    auto& metric = out_directory[metric_name];
    for (std::int64_t row = 0; row < count; row++)
    {
        if (row % 1000000 == 0)
        {
            std::cout << row << " rows completed." << std::endl;
        }
        metric.insert(hta::TimeValue(
            hta::TimePoint(hta::duration_cast(std::chrono::milliseconds(1 + 50 * row))), 42.0));
    }
}